

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_nodes.cpp
# Opt level: O1

SerializedCSVReaderOptions *
duckdb::SerializedCSVReaderOptions::Deserialize
          (SerializedCSVReaderOptions *__return_storage_ptr__,Deserializer *deserializer)

{
  vector<bool,_true> *pvVar1;
  undefined1 *puVar2;
  long lVar3;
  FileCompressionType FVar4;
  undefined1 uVar5;
  CSVOption<char> single_byte_delimiter;
  CSVOption<char> CVar6;
  CSVOption<char> CVar7;
  CSVOption<bool> CVar8;
  CSVOption<duckdb::NewLineIdentifier> CVar9;
  CSVOption<char> CVar10;
  CSVOption<bool> CVar11;
  int iVar12;
  uint uVar13;
  idx_t iVar14;
  undefined4 extraout_var_01;
  _func_int **pp_Var15;
  idx_t iVar16;
  undefined4 extraout_var_03;
  undefined6 extraout_var;
  undefined4 extraout_var_04;
  undefined4 uVar17;
  CSVOption<unsigned_long> CVar18;
  CSVOption<unsigned_long> CVar19;
  vector<bool,_true> options_was_type_manually_set;
  vector<bool,_true> options_force_quote;
  vector<bool,_true> options_force_not_null;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> options_rejects_table_name;
  CSVOption<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  options_multi_byte_delimiter;
  CSVOption<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  options_rejects_scan_name;
  MultiFileOptions file_options;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> options_encoding;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
  options_sniffer_user_mismatch_error;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> options_decimal_separator;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> options_file_path;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  options_sql_types_per_column;
  map<duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>_>_>_>
  options_dialect_options_date_format;
  bool local_42c;
  bool local_428;
  bool local_424;
  bool local_420;
  bool local_41c;
  bool local_418;
  CSVOption<bool> local_414;
  vector<bool,_true> local_410;
  vector<bool,_true> local_3e8;
  vector<bool,_true> local_3c0;
  undefined4 local_394;
  ulong *local_390;
  long local_388;
  ulong local_380;
  undefined8 uStack_378;
  idx_t local_370;
  idx_t local_368;
  idx_t local_360;
  CSVOption<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_358;
  undefined8 uStack_330;
  undefined8 local_328 [2];
  ulong *local_318;
  long local_310;
  undefined1 local_308;
  uint7 uStack_307;
  undefined8 uStack_300;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_2f8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_2d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_2b8;
  undefined4 local_296;
  undefined3 uStack_292;
  undefined4 local_28f;
  undefined3 uStack_28b;
  undefined1 local_288;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_280;
  size_type local_278;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_270;
  idx_t local_260;
  unsigned_long local_258;
  unsigned_long local_250;
  CSVOption<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_248;
  ulong *local_220;
  long local_218;
  ulong local_210;
  undefined4 uStack_208;
  undefined4 uStack_204;
  MultiFileOptions local_200;
  undefined1 *local_168;
  undefined8 local_160;
  undefined1 local_158;
  undefined8 local_157;
  undefined4 local_14f;
  undefined2 local_14b;
  char local_149;
  undefined1 *local_148;
  long local_140;
  undefined1 local_138 [16];
  undefined1 *local_128;
  undefined8 local_120;
  undefined1 local_118 [9];
  undefined4 local_10f;
  undefined2 local_10b;
  char local_109;
  undefined1 *local_108;
  undefined8 local_100;
  undefined1 local_f8 [9];
  undefined4 local_ef;
  undefined2 local_eb;
  undefined1 local_e9;
  undefined1 *local_e8;
  undefined8 local_e0;
  undefined1 local_d8 [9];
  undefined4 local_cf;
  undefined2 local_cb;
  undefined1 local_c9;
  undefined1 local_c8 [8];
  pointer pbStack_c0;
  pointer local_b8;
  LogicalType local_b0;
  type local_98;
  _Rb_tree<duckdb::LogicalTypeId,_std::pair<const_duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>_>,_std::_Select1st<std::pair<const_duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>_>_>,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>_>_>_>
  local_60;
  undefined4 extraout_var_00;
  undefined4 extraout_var_02;
  
  iVar12 = (*deserializer->_vptr_Deserializer[4])(deserializer,100,"ignore_errors");
  if ((char)iVar12 == '\0') {
    local_414.set_by_user = false;
    local_414.value = false;
    (*deserializer->_vptr_Deserializer[5])(deserializer,0);
  }
  else {
    uVar13 = (*deserializer->_vptr_Deserializer[0xc])(deserializer);
    (*deserializer->_vptr_Deserializer[5])(deserializer,1);
    local_414 = SUB42((uVar13 & 0xff) << 8,0);
  }
  uVar13 = (*deserializer->_vptr_Deserializer[4])(deserializer,0x65,"buffer_sample_size");
  pp_Var15 = deserializer->_vptr_Deserializer;
  if ((char)uVar13 == '\0') {
    iVar14 = 0;
  }
  else {
    iVar12 = (*pp_Var15[0x15])(deserializer);
    iVar14 = CONCAT44(extraout_var_00,iVar12);
    pp_Var15 = deserializer->_vptr_Deserializer;
  }
  (*pp_Var15[5])(deserializer,(ulong)(uVar13 & 0xff));
  Deserializer::ReadPropertyWithDefault<duckdb::vector<std::__cxx11::string,true>>
            (&local_2b8,deserializer,0x66,"null_str");
  (*deserializer->_vptr_Deserializer[2])(deserializer,0x67,"compression");
  if (deserializer->deserialize_enum_from_string == true) {
    (*deserializer->_vptr_Deserializer[0x1a])(&local_200,deserializer);
    FVar4 = EnumUtil::FromString<duckdb::FileCompressionType>
                      ((char *)CONCAT26(local_200._6_2_,CONCAT24(local_200._4_2_,local_200._0_4_)));
    puVar2 = (undefined1 *)CONCAT26(local_200._6_2_,CONCAT24(local_200._4_2_,local_200._0_4_));
    if ((size_type *)puVar2 != &local_200.hive_types_schema._M_h._M_bucket_count) {
      operator_delete(puVar2);
    }
  }
  else {
    iVar12 = (*deserializer->_vptr_Deserializer[0xf])(deserializer);
    FVar4 = (FileCompressionType)iVar12;
  }
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  iVar12 = (*deserializer->_vptr_Deserializer[4])(deserializer,0x68,"allow_quoted_nulls");
  if ((char)iVar12 == '\0') {
    local_418 = false;
    (*deserializer->_vptr_Deserializer[5])(deserializer,0);
  }
  else {
    iVar12 = (*deserializer->_vptr_Deserializer[0xc])(deserializer);
    local_418 = SUB41(iVar12,0);
    (*deserializer->_vptr_Deserializer[5])(deserializer,1);
  }
  (*deserializer->_vptr_Deserializer[2])(deserializer,0x69,"maximum_line_size");
  (*deserializer->_vptr_Deserializer[6])(deserializer);
  CVar18 = CSVOption<unsigned_long>::Deserialize(deserializer);
  local_250 = CVar18.value;
  (*deserializer->_vptr_Deserializer[7])(deserializer);
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  iVar12 = (*deserializer->_vptr_Deserializer[4])(deserializer,0x6a,"normalize_names");
  if ((char)iVar12 == '\0') {
    local_41c = false;
    (*deserializer->_vptr_Deserializer[5])(deserializer,0);
  }
  else {
    iVar12 = (*deserializer->_vptr_Deserializer[0xc])(deserializer);
    local_41c = SUB41(iVar12,0);
    (*deserializer->_vptr_Deserializer[5])(deserializer,1);
  }
  Deserializer::ReadPropertyWithDefault<duckdb::vector<bool,true>>
            (&local_3c0,deserializer,0x6b,"force_not_null");
  iVar12 = (*deserializer->_vptr_Deserializer[4])(deserializer,0x6c,"all_varchar");
  if ((char)iVar12 == '\0') {
    local_420 = false;
    (*deserializer->_vptr_Deserializer[5])(deserializer,0);
  }
  else {
    iVar12 = (*deserializer->_vptr_Deserializer[0xc])(deserializer);
    local_420 = SUB41(iVar12,0);
    (*deserializer->_vptr_Deserializer[5])(deserializer,1);
  }
  iVar12 = (*deserializer->_vptr_Deserializer[4])(deserializer,0x6d,"sample_size_chunks");
  if ((char)iVar12 == '\0') {
    local_360 = 0;
    (*deserializer->_vptr_Deserializer[5])(deserializer,0);
  }
  else {
    iVar12 = (*deserializer->_vptr_Deserializer[0x15])(deserializer);
    local_360 = CONCAT44(extraout_var_01,iVar12);
    (*deserializer->_vptr_Deserializer[5])(deserializer,1);
  }
  iVar12 = (*deserializer->_vptr_Deserializer[4])(deserializer,0x6e,"auto_detect");
  if ((char)iVar12 == '\0') {
    local_424 = false;
    (*deserializer->_vptr_Deserializer[5])(deserializer,0);
  }
  else {
    iVar12 = (*deserializer->_vptr_Deserializer[0xc])(deserializer);
    local_424 = SUB41(iVar12,0);
    (*deserializer->_vptr_Deserializer[5])(deserializer,1);
  }
  iVar12 = (*deserializer->_vptr_Deserializer[4])(deserializer,0x6f,"file_path");
  if ((char)iVar12 == '\0') {
    (*deserializer->_vptr_Deserializer[5])(deserializer,0);
    local_200.hive_types_schema._M_h._M_bucket_count._0_1_ = 0;
    local_e8 = local_d8;
    local_d8[0] = 0;
    local_d8._1_8_ = local_200.hive_types_schema._M_h._9_8_;
    local_cf = local_200.hive_types_schema._M_h._M_before_begin._M_nxt._1_4_;
    local_cb = local_200.hive_types_schema._M_h._M_before_begin._M_nxt._5_2_;
    local_c9 = local_200.hive_types_schema._M_h._M_before_begin._M_nxt._7_1_;
    local_e0 = 0;
  }
  else {
    (*deserializer->_vptr_Deserializer[0x1a])(&local_e8,deserializer);
    (*deserializer->_vptr_Deserializer[5])(deserializer,1);
  }
  iVar12 = (*deserializer->_vptr_Deserializer[4])(deserializer,0x70,"decimal_separator");
  if ((char)iVar12 == '\0') {
    (*deserializer->_vptr_Deserializer[5])(deserializer,0);
    local_200.hive_types_schema._M_h._M_bucket_count._0_1_ = 0;
    local_108 = local_f8;
    local_f8[0] = 0;
    local_f8._1_8_ = local_200.hive_types_schema._M_h._9_8_;
    local_ef = local_200.hive_types_schema._M_h._M_before_begin._M_nxt._1_4_;
    local_eb = local_200.hive_types_schema._M_h._M_before_begin._M_nxt._5_2_;
    local_e9 = local_200.hive_types_schema._M_h._M_before_begin._M_nxt._7_1_;
    local_100 = 0;
  }
  else {
    (*deserializer->_vptr_Deserializer[0x1a])(&local_108,deserializer);
    (*deserializer->_vptr_Deserializer[5])(deserializer,1);
  }
  iVar12 = (*deserializer->_vptr_Deserializer[4])(deserializer,0x71,"null_padding");
  if ((char)iVar12 == '\0') {
    local_428 = false;
    (*deserializer->_vptr_Deserializer[5])(deserializer,0);
  }
  else {
    iVar12 = (*deserializer->_vptr_Deserializer[0xc])(deserializer);
    local_428 = SUB41(iVar12,0);
    (*deserializer->_vptr_Deserializer[5])(deserializer,1);
  }
  uVar13 = (*deserializer->_vptr_Deserializer[4])(deserializer,0x72,"buffer_size");
  pp_Var15 = deserializer->_vptr_Deserializer;
  if ((char)uVar13 != '\0') {
    (*pp_Var15[0x15])(deserializer);
    pp_Var15 = deserializer->_vptr_Deserializer;
  }
  (*pp_Var15[5])(deserializer,(ulong)(uVar13 & 0xff));
  (*deserializer->_vptr_Deserializer[2])(deserializer,0x73,"file_options");
  (*deserializer->_vptr_Deserializer[6])(deserializer);
  MultiFileOptions::Deserialize(&local_200,deserializer);
  (*deserializer->_vptr_Deserializer[7])(deserializer);
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  Deserializer::ReadPropertyWithDefault<duckdb::vector<bool,true>>
            (&local_3e8,deserializer,0x74,"force_quote");
  local_318 = (ulong *)&local_308;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_318,"reject_errors","");
  iVar12 = (*deserializer->_vptr_Deserializer[4])(deserializer,0x75,"rejects_table_name");
  if ((char)iVar12 == '\0') {
    (*deserializer->_vptr_Deserializer[5])(deserializer,0);
    local_390 = &local_380;
    if (local_318 == (ulong *)&local_308) {
      uStack_378 = uStack_300;
    }
    else {
      local_390 = local_318;
    }
    local_380 = (ulong)uStack_307 << 8;
    local_388 = local_310;
    local_310 = 0;
    local_308 = 0;
    local_318 = (ulong *)&local_308;
  }
  else {
    (*deserializer->_vptr_Deserializer[0x1a])(&local_390,deserializer);
    (*deserializer->_vptr_Deserializer[5])(deserializer,1);
  }
  if (local_318 != (ulong *)&local_308) {
    operator_delete(local_318);
  }
  iVar12 = (*deserializer->_vptr_Deserializer[4])(deserializer,0x76,"rejects_limit");
  if ((char)iVar12 == '\0') {
    iVar16 = 0;
    (*deserializer->_vptr_Deserializer[5])(deserializer,0);
  }
  else {
    iVar12 = (*deserializer->_vptr_Deserializer[0x15])(deserializer);
    iVar16 = CONCAT44(extraout_var_02,iVar12);
    (*deserializer->_vptr_Deserializer[5])(deserializer,1);
  }
  Deserializer::ReadDeletedProperty<duckdb::vector<std::__cxx11::string,true>>
            (deserializer,0x77,"rejects_recovery_columns");
  Deserializer::ReadDeletedProperty<duckdb::vector<unsigned_long,true>>
            (deserializer,0x78,"rejects_recovery_column_ids");
  (*deserializer->_vptr_Deserializer[2])(deserializer,0x79,"delimiter");
  (*deserializer->_vptr_Deserializer[6])(deserializer);
  single_byte_delimiter = CSVOption<char>::Deserialize(deserializer);
  (*deserializer->_vptr_Deserializer[7])(deserializer);
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  (*deserializer->_vptr_Deserializer[2])(deserializer,0x7a,"quote");
  (*deserializer->_vptr_Deserializer[6])(deserializer);
  CVar6 = CSVOption<char>::Deserialize(deserializer);
  (*deserializer->_vptr_Deserializer[7])(deserializer);
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  (*deserializer->_vptr_Deserializer[2])(deserializer,0x7b,"escape");
  (*deserializer->_vptr_Deserializer[6])(deserializer);
  CVar7 = CSVOption<char>::Deserialize(deserializer);
  (*deserializer->_vptr_Deserializer[7])(deserializer);
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  (*deserializer->_vptr_Deserializer[2])(deserializer,0x7c,"header");
  (*deserializer->_vptr_Deserializer[6])(deserializer);
  CVar8 = CSVOption<bool>::Deserialize(deserializer);
  (*deserializer->_vptr_Deserializer[7])(deserializer);
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  iVar12 = (*deserializer->_vptr_Deserializer[4])(deserializer,0x7d,"num_cols");
  if ((char)iVar12 == '\0') {
    local_368 = 0;
    (*deserializer->_vptr_Deserializer[5])(deserializer,0);
  }
  else {
    iVar12 = (*deserializer->_vptr_Deserializer[0x15])(deserializer);
    local_368 = CONCAT44(extraout_var_03,iVar12);
    (*deserializer->_vptr_Deserializer[5])(deserializer,1);
  }
  (*deserializer->_vptr_Deserializer[2])(deserializer,0x7e,"new_line");
  (*deserializer->_vptr_Deserializer[6])(deserializer);
  CVar9 = CSVOption<duckdb::NewLineIdentifier>::Deserialize(deserializer);
  (*deserializer->_vptr_Deserializer[7])(deserializer);
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  (*deserializer->_vptr_Deserializer[2])(deserializer,0x7f,"skip_rows");
  (*deserializer->_vptr_Deserializer[6])(deserializer);
  CVar19 = CSVOption<unsigned_long>::Deserialize(deserializer);
  local_258 = CVar19.value;
  (*deserializer->_vptr_Deserializer[7])(deserializer);
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  (*deserializer->_vptr_Deserializer[2])(deserializer,0x80,"date_format");
  Deserializer::
  Read<std::map<duckdb::LogicalTypeId,duckdb::CSVOption<duckdb::StrpTimeFormat>,std::less<duckdb::LogicalTypeId>,std::allocator<std::pair<duckdb::LogicalTypeId_const,duckdb::CSVOption<duckdb::StrpTimeFormat>>>>>
            ((type *)&local_60,deserializer);
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  iVar12 = (*deserializer->_vptr_Deserializer[4])(deserializer,0x81,"sniffer_user_mismatch_error");
  if ((char)iVar12 == '\0') {
    (*deserializer->_vptr_Deserializer[5])(deserializer,0);
    local_358.value._M_string_length._0_1_ = 0;
    local_128 = local_118;
    local_118[0] = 0;
    local_10f = local_358.value.field_2._M_allocated_capacity._1_4_;
    local_10b = local_358.value.field_2._M_allocated_capacity._5_2_;
    local_109 = local_358.value.field_2._M_local_buf[7];
    local_120 = 0;
  }
  else {
    (*deserializer->_vptr_Deserializer[0x1a])(&local_128,deserializer);
    (*deserializer->_vptr_Deserializer[5])(deserializer,1);
  }
  iVar12 = (*deserializer->_vptr_Deserializer[4])(deserializer,0x82,"parallel");
  if ((char)iVar12 == '\0') {
    local_42c = false;
    (*deserializer->_vptr_Deserializer[5])(deserializer,0);
  }
  else {
    iVar12 = (*deserializer->_vptr_Deserializer[0xc])(deserializer);
    local_42c = SUB41(iVar12,0);
    (*deserializer->_vptr_Deserializer[5])(deserializer,1);
  }
  local_260 = iVar16;
  Deserializer::ReadPropertyWithDefault<duckdb::vector<bool,true>>
            (&local_410,deserializer,0x83,"was_type_manually_set");
  local_148 = local_138;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"reject_scans","");
  local_288 = 0;
  local_280 = &local_270;
  ::std::__cxx11::string::_M_construct<char*>((string *)&local_280,local_148,local_148 + local_140);
  iVar12 = (*deserializer->_vptr_Deserializer[4])(deserializer,0x84,"rejects_scan_name");
  if ((char)iVar12 == '\0') {
    (*deserializer->_vptr_Deserializer[5])(deserializer,0);
    local_248.value._M_dataplus._M_p = (pointer)&local_248.value.field_2;
    local_248.set_by_user = (bool)local_288;
    if (local_280 == &local_270) {
      local_248.value.field_2._8_8_ = local_270._8_8_;
    }
    else {
      local_248.value._M_dataplus._M_p = (pointer)local_280;
    }
    local_248.value._M_string_length = local_278;
    local_278 = 0;
    local_270._M_local_buf[0] = '\0';
    local_280 = &local_270;
  }
  else {
    (*deserializer->_vptr_Deserializer[6])(deserializer);
    CSVOption<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    Deserialize(&local_248,deserializer);
    (*deserializer->_vptr_Deserializer[7])(deserializer);
    (*deserializer->_vptr_Deserializer[5])(deserializer,1);
  }
  if (local_280 != &local_270) {
    operator_delete(local_280);
  }
  if (local_148 != local_138) {
    operator_delete(local_148);
  }
  Deserializer::ReadPropertyWithDefault<duckdb::vector<std::__cxx11::string,true>>
            (&local_2d8,deserializer,0x85,"name_list");
  Deserializer::ReadPropertyWithDefault<duckdb::vector<duckdb::LogicalType,true>>
            ((vector<duckdb::LogicalType,_true> *)&local_2f8,deserializer,0x86,"sql_type_list");
  iVar12 = (*deserializer->_vptr_Deserializer[4])(deserializer,0x87,"sql_types_per_column");
  if ((char)iVar12 == '\0') {
    (*deserializer->_vptr_Deserializer[5])(deserializer,0);
    local_358._0_8_ = local_328;
    local_358.value._M_string_length._0_1_ = 0;
    local_358.value._M_string_length._1_7_ = 0;
    local_358.value.field_2._M_local_buf[0] = '\0';
    local_358.value.field_2._M_allocated_capacity._1_4_ = 0;
    local_358.value.field_2._M_allocated_capacity._5_2_ = 0;
    local_358.value.field_2._M_local_buf[7] = '\0';
    local_358.value._M_dataplus._M_p = &DAT_00000001;
    local_358.value.field_2._8_8_ = 0x3f800000;
    uStack_330 = 0;
    local_328[0] = 0;
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)&local_98,
                 (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)&local_358,
                 (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)&local_358);
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)&local_358);
  }
  else {
    Deserializer::
    Read<std::unordered_map<std::__cxx11::string,unsigned_long,duckdb::CaseInsensitiveStringHashFunction,duckdb::CaseInsensitiveStringEquality,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>>
              (&local_98,deserializer);
    (*deserializer->_vptr_Deserializer[5])(deserializer,1);
  }
  iVar12 = (*deserializer->_vptr_Deserializer[4])(deserializer,0x88,"columns_set");
  if ((char)iVar12 == '\0') {
    uVar5 = false;
    (*deserializer->_vptr_Deserializer[5])(deserializer,0);
  }
  else {
    iVar12 = (*deserializer->_vptr_Deserializer[0xc])(deserializer);
    uVar5 = (undefined1)iVar12;
    (*deserializer->_vptr_Deserializer[5])(deserializer,1);
  }
  iVar12 = (*deserializer->_vptr_Deserializer[4])(deserializer,0x89,"comment");
  if ((char)iVar12 == '\0') {
    uVar17 = 0;
    (*deserializer->_vptr_Deserializer[5])(deserializer,0);
  }
  else {
    (*deserializer->_vptr_Deserializer[6])(deserializer);
    CVar10 = CSVOption<char>::Deserialize(deserializer);
    uVar17 = (undefined4)CONCAT62(extraout_var,CVar10);
    (*deserializer->_vptr_Deserializer[7])(deserializer);
    (*deserializer->_vptr_Deserializer[5])(deserializer,1);
  }
  iVar12 = (*deserializer->_vptr_Deserializer[4])(deserializer,0x8a,"rows_until_header");
  if ((char)iVar12 == '\0') {
    local_370 = 0;
    (*deserializer->_vptr_Deserializer[5])(deserializer,0);
  }
  else {
    iVar12 = (*deserializer->_vptr_Deserializer[0x15])(deserializer);
    local_370 = CONCAT44(extraout_var_04,iVar12);
    (*deserializer->_vptr_Deserializer[5])(deserializer,1);
  }
  iVar12 = (*deserializer->_vptr_Deserializer[4])(deserializer,0x8b,"encoding");
  if ((char)iVar12 == '\0') {
    (*deserializer->_vptr_Deserializer[5])(deserializer,0);
    local_358.value._M_string_length._0_1_ = 0;
    local_168 = &local_158;
    local_158 = 0;
    local_157 = CONCAT17(local_358.value.field_2._M_local_buf[0],
                         local_358.value._M_string_length._1_7_);
    local_14f = local_358.value.field_2._M_allocated_capacity._1_4_;
    local_14b = local_358.value.field_2._M_allocated_capacity._5_2_;
    local_149 = local_358.value.field_2._M_local_buf[7];
    local_160 = 0;
  }
  else {
    (*deserializer->_vptr_Deserializer[0x1a])(&local_168,deserializer);
    (*deserializer->_vptr_Deserializer[5])(deserializer,1);
  }
  (*deserializer->_vptr_Deserializer[2])(deserializer,0x8c,"strict_mode");
  (*deserializer->_vptr_Deserializer[6])(deserializer);
  CVar11 = CSVOption<bool>::Deserialize(deserializer);
  (*deserializer->_vptr_Deserializer[7])(deserializer);
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  (*deserializer->_vptr_Deserializer[2])(deserializer,0x8d,"multi_byte_delimiter");
  (*deserializer->_vptr_Deserializer[6])(deserializer);
  CSVOption<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  Deserialize(&local_358,deserializer);
  (*deserializer->_vptr_Deserializer[7])(deserializer);
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  SerializedCSVReaderOptions(__return_storage_ptr__,single_byte_delimiter,&local_358);
  (__return_storage_ptr__->options).ignore_errors = local_414;
  (__return_storage_ptr__->options).buffer_sample_size = iVar14;
  local_c8 = (undefined1  [8])
             (__return_storage_ptr__->options).null_str.
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  pbStack_c0 = (__return_storage_ptr__->options).null_str.
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
  local_b8 = (__return_storage_ptr__->options).null_str.
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (__return_storage_ptr__->options).null_str.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_2b8.
       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (__return_storage_ptr__->options).null_str.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_2b8.
       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->options).null_str.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_2b8.
       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_2b8.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2b8.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2b8.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_394 = uVar17;
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_c8);
  (__return_storage_ptr__->options).compression = FVar4;
  (__return_storage_ptr__->options).allow_quoted_nulls = local_418;
  (__return_storage_ptr__->options).maximum_line_size.set_by_user = CVar18.set_by_user;
  *(undefined4 *)&(__return_storage_ptr__->options).maximum_line_size.field_0x1 = local_28f;
  *(uint *)&(__return_storage_ptr__->options).maximum_line_size.field_0x4 =
       CONCAT31(uStack_28b,local_28f._3_1_);
  (__return_storage_ptr__->options).maximum_line_size.value = local_250;
  (__return_storage_ptr__->options).normalize_names = local_41c;
  pvVar1 = &(__return_storage_ptr__->options).force_not_null;
  ::std::_Bvector_base<std::allocator<bool>_>::_M_deallocate
            ((_Bvector_base<std::allocator<bool>_> *)pvVar1);
  (__return_storage_ptr__->options).force_not_null.super_vector<bool,_std::allocator<bool>_>.
  super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_end_of_storage =
       local_3c0.super_vector<bool,_std::allocator<bool>_>.
       super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_end_of_storage
  ;
  (__return_storage_ptr__->options).force_not_null.super_vector<bool,_std::allocator<bool>_>.
  super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p =
       local_3c0.super_vector<bool,_std::allocator<bool>_>.
       super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
       super__Bit_iterator_base._M_p;
  *(ulong *)&(__return_storage_ptr__->options).force_not_null.
             super_vector<bool,_std::allocator<bool>_>.super__Bvector_base<std::allocator<bool>_>.
             _M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset =
       CONCAT44(local_3c0.super_vector<bool,_std::allocator<bool>_>.
                super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                _M_finish.super__Bit_iterator_base._12_4_,
                local_3c0.super_vector<bool,_std::allocator<bool>_>.
                super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                _M_finish.super__Bit_iterator_base._M_offset);
  (pvVar1->super_vector<bool,_std::allocator<bool>_>).super__Bvector_base<std::allocator<bool>_>.
  _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p =
       local_3c0.super_vector<bool,_std::allocator<bool>_>.
       super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
       super__Bit_iterator_base._M_p;
  *(ulong *)&(__return_storage_ptr__->options).force_not_null.
             super_vector<bool,_std::allocator<bool>_>.super__Bvector_base<std::allocator<bool>_>.
             _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset =
       CONCAT44(local_3c0.super_vector<bool,_std::allocator<bool>_>.
                super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
                .super__Bit_iterator_base._12_4_,
                local_3c0.super_vector<bool,_std::allocator<bool>_>.
                super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
                .super__Bit_iterator_base._M_offset);
  local_3c0.super_vector<bool,_std::allocator<bool>_>.super__Bvector_base<std::allocator<bool>_>.
  _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_3c0.super_vector<bool,_std::allocator<bool>_>.super__Bvector_base<std::allocator<bool>_>.
  _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
  local_3c0.super_vector<bool,_std::allocator<bool>_>.super__Bvector_base<std::allocator<bool>_>.
  _M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_3c0.super_vector<bool,_std::allocator<bool>_>.super__Bvector_base<std::allocator<bool>_>.
  _M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
  local_3c0.super_vector<bool,_std::allocator<bool>_>.super__Bvector_base<std::allocator<bool>_>.
  _M_impl.super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
  (__return_storage_ptr__->options).all_varchar = local_420;
  (__return_storage_ptr__->options).sample_size_chunks = local_360;
  (__return_storage_ptr__->options).auto_detect = local_424;
  ::std::__cxx11::string::operator=
            ((string *)&(__return_storage_ptr__->options).file_path,(string *)&local_e8);
  ::std::__cxx11::string::operator=
            ((string *)&(__return_storage_ptr__->options).decimal_separator,(string *)&local_108);
  (__return_storage_ptr__->options).null_padding = local_428;
  (__return_storage_ptr__->file_options).filename = local_200.filename;
  (__return_storage_ptr__->file_options).hive_partitioning = local_200.hive_partitioning;
  (__return_storage_ptr__->file_options).auto_detect_hive_partitioning =
       local_200.auto_detect_hive_partitioning;
  (__return_storage_ptr__->file_options).union_by_name = local_200.union_by_name;
  (__return_storage_ptr__->file_options).hive_types_autocast = local_200.hive_types_autocast;
  (__return_storage_ptr__->file_options).mapping = local_200.mapping;
  if (&local_200 != &__return_storage_ptr__->file_options) {
    ::std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::LogicalType>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::
    _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::LogicalType>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::LogicalType>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)&(__return_storage_ptr__->file_options).hive_types_schema,
               &local_200.hive_types_schema._M_h);
  }
  ::std::__cxx11::string::_M_assign
            ((string *)&(__return_storage_ptr__->file_options).filename_column);
  if (&local_200 != &__return_storage_ptr__->file_options) {
    ::std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::Value>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::
    _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::Value>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::Value>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)&(__return_storage_ptr__->file_options).custom_options,
               &local_200.custom_options._M_h);
  }
  pvVar1 = &(__return_storage_ptr__->options).force_quote;
  ::std::_Bvector_base<std::allocator<bool>_>::_M_deallocate
            ((_Bvector_base<std::allocator<bool>_> *)pvVar1);
  lVar3 = local_388;
  (__return_storage_ptr__->options).force_quote.super_vector<bool,_std::allocator<bool>_>.
  super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_end_of_storage =
       local_3e8.super_vector<bool,_std::allocator<bool>_>.
       super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_end_of_storage
  ;
  *(undefined4 *)
   &(__return_storage_ptr__->options).force_quote.super_vector<bool,_std::allocator<bool>_>.
    super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p =
       local_3e8.super_vector<bool,_std::allocator<bool>_>.
       super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
       super__Bit_iterator_base._M_p._0_4_;
  *(undefined4 *)
   ((long)&(__return_storage_ptr__->options).force_quote.super_vector<bool,_std::allocator<bool>_>.
           super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
           super__Bit_iterator_base._M_p + 4) =
       local_3e8.super_vector<bool,_std::allocator<bool>_>.
       super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
       super__Bit_iterator_base._M_p._4_4_;
  (__return_storage_ptr__->options).force_quote.super_vector<bool,_std::allocator<bool>_>.
  super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_offset =
       local_3e8.super_vector<bool,_std::allocator<bool>_>.
       super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
       super__Bit_iterator_base._M_offset;
  *(undefined4 *)
   &(__return_storage_ptr__->options).force_quote.super_vector<bool,_std::allocator<bool>_>.
    super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base.field_0xc =
       local_3e8.super_vector<bool,_std::allocator<bool>_>.
       super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
       super__Bit_iterator_base._12_4_;
  *(undefined4 *)
   &(pvVar1->super_vector<bool,_std::allocator<bool>_>).super__Bvector_base<std::allocator<bool>_>.
    _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p =
       local_3e8.super_vector<bool,_std::allocator<bool>_>.
       super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
       super__Bit_iterator_base._M_p._0_4_;
  *(undefined4 *)
   ((long)&(__return_storage_ptr__->options).force_quote.super_vector<bool,_std::allocator<bool>_>.
           super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
           super__Bit_iterator_base._M_p + 4) =
       local_3e8.super_vector<bool,_std::allocator<bool>_>.
       super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
       super__Bit_iterator_base._M_p._4_4_;
  (__return_storage_ptr__->options).force_quote.super_vector<bool,_std::allocator<bool>_>.
  super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_offset =
       local_3e8.super_vector<bool,_std::allocator<bool>_>.
       super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
       super__Bit_iterator_base._M_offset;
  *(undefined4 *)
   &(__return_storage_ptr__->options).force_quote.super_vector<bool,_std::allocator<bool>_>.
    super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base.field_0xc =
       local_3e8.super_vector<bool,_std::allocator<bool>_>.
       super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
       super__Bit_iterator_base._12_4_;
  local_3e8.super_vector<bool,_std::allocator<bool>_>.super__Bvector_base<std::allocator<bool>_>.
  _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_3e8.super_vector<bool,_std::allocator<bool>_>.super__Bvector_base<std::allocator<bool>_>.
  _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
  local_3e8.super_vector<bool,_std::allocator<bool>_>.super__Bvector_base<std::allocator<bool>_>.
  _M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_3e8.super_vector<bool,_std::allocator<bool>_>.super__Bvector_base<std::allocator<bool>_>.
  _M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
  local_3e8.super_vector<bool,_std::allocator<bool>_>.super__Bvector_base<std::allocator<bool>_>.
  _M_impl.super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
  if (local_390 == &local_380) {
    uStack_208 = (undefined4)uStack_378;
    uStack_204 = uStack_378._4_4_;
    local_220 = &local_210;
  }
  else {
    local_220 = local_390;
  }
  local_218 = local_388;
  local_388 = 0;
  local_380 = local_380 & 0xffffffffffffff00;
  local_c8 = (undefined1  [8])((ulong)local_c8 & 0xffffffffffffff00);
  local_390 = &local_380;
  pbStack_c0 = (pointer)&local_b0;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&pbStack_c0,local_220,(undefined1 *)(lVar3 + (long)local_220));
  (__return_storage_ptr__->options).rejects_table_name.set_by_user = (bool)local_c8[0];
  ::std::__cxx11::string::operator=
            ((string *)&(__return_storage_ptr__->options).rejects_table_name.value,
             (string *)&pbStack_c0);
  if (pbStack_c0 != (pointer)&local_b0) {
    operator_delete(pbStack_c0);
  }
  iVar14 = local_260;
  if (local_220 != &local_210) {
    operator_delete(local_220);
  }
  (__return_storage_ptr__->options).rejects_limit = iVar14;
  (__return_storage_ptr__->options).dialect_options.state_machine_options.quote = CVar6;
  (__return_storage_ptr__->options).dialect_options.state_machine_options.escape = CVar7;
  (__return_storage_ptr__->options).dialect_options.header = CVar8;
  (__return_storage_ptr__->options).dialect_options.num_cols = local_368;
  (__return_storage_ptr__->options).dialect_options.state_machine_options.new_line = CVar9;
  (__return_storage_ptr__->options).dialect_options.skip_rows.set_by_user = CVar19.set_by_user;
  *(undefined4 *)&(__return_storage_ptr__->options).dialect_options.skip_rows.field_0x1 = local_296;
  *(uint *)&(__return_storage_ptr__->options).dialect_options.skip_rows.field_0x4 =
       CONCAT31(uStack_292,local_296._3_1_);
  (__return_storage_ptr__->options).dialect_options.skip_rows.value = local_258;
  ::std::
  _Rb_tree<duckdb::LogicalTypeId,_std::pair<const_duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>_>,_std::_Select1st<std::pair<const_duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>_>_>,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>_>_>_>
  ::operator=(&(__return_storage_ptr__->options).dialect_options.date_format._M_t,&local_60);
  ::std::__cxx11::string::operator=
            ((string *)&(__return_storage_ptr__->options).sniffer_user_mismatch_error,
             (string *)&local_128);
  (__return_storage_ptr__->options).parallel = local_42c;
  pvVar1 = &(__return_storage_ptr__->options).was_type_manually_set;
  ::std::_Bvector_base<std::allocator<bool>_>::_M_deallocate
            ((_Bvector_base<std::allocator<bool>_> *)pvVar1);
  (__return_storage_ptr__->options).was_type_manually_set.super_vector<bool,_std::allocator<bool>_>.
  super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_end_of_storage =
       local_410.super_vector<bool,_std::allocator<bool>_>.
       super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_end_of_storage
  ;
  (__return_storage_ptr__->options).was_type_manually_set.super_vector<bool,_std::allocator<bool>_>.
  super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p =
       local_410.super_vector<bool,_std::allocator<bool>_>.
       super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
       super__Bit_iterator_base._M_p;
  *(ulong *)&(__return_storage_ptr__->options).was_type_manually_set.
             super_vector<bool,_std::allocator<bool>_>.super__Bvector_base<std::allocator<bool>_>.
             _M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset =
       CONCAT44(local_410.super_vector<bool,_std::allocator<bool>_>.
                super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                _M_finish.super__Bit_iterator_base._12_4_,
                local_410.super_vector<bool,_std::allocator<bool>_>.
                super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                _M_finish.super__Bit_iterator_base._M_offset);
  (pvVar1->super_vector<bool,_std::allocator<bool>_>).super__Bvector_base<std::allocator<bool>_>.
  _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p =
       local_410.super_vector<bool,_std::allocator<bool>_>.
       super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
       super__Bit_iterator_base._M_p;
  *(ulong *)&(__return_storage_ptr__->options).was_type_manually_set.
             super_vector<bool,_std::allocator<bool>_>.super__Bvector_base<std::allocator<bool>_>.
             _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset =
       CONCAT44(local_410.super_vector<bool,_std::allocator<bool>_>.
                super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
                .super__Bit_iterator_base._12_4_,
                local_410.super_vector<bool,_std::allocator<bool>_>.
                super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
                .super__Bit_iterator_base._M_offset);
  local_410.super_vector<bool,_std::allocator<bool>_>.super__Bvector_base<std::allocator<bool>_>.
  _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_410.super_vector<bool,_std::allocator<bool>_>.super__Bvector_base<std::allocator<bool>_>.
  _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
  local_410.super_vector<bool,_std::allocator<bool>_>.super__Bvector_base<std::allocator<bool>_>.
  _M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_410.super_vector<bool,_std::allocator<bool>_>.super__Bvector_base<std::allocator<bool>_>.
  _M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
  local_410.super_vector<bool,_std::allocator<bool>_>.super__Bvector_base<std::allocator<bool>_>.
  _M_impl.super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
  (__return_storage_ptr__->options).rejects_scan_name.set_by_user = local_248.set_by_user;
  ::std::__cxx11::string::_M_assign
            ((string *)&(__return_storage_ptr__->options).rejects_scan_name.value);
  local_c8 = (undefined1  [8])
             (__return_storage_ptr__->options).name_list.
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  pbStack_c0 = (__return_storage_ptr__->options).name_list.
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
  local_b8 = (__return_storage_ptr__->options).name_list.
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (__return_storage_ptr__->options).name_list.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_2d8.
       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (__return_storage_ptr__->options).name_list.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_2d8.
       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->options).name_list.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_2d8.
       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_2d8.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2d8.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2d8.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_c8);
  local_c8 = (undefined1  [8])
             (__return_storage_ptr__->options).sql_type_list.
             super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
             super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
             super__Vector_impl_data._M_start;
  pbStack_c0 = (pointer)(__return_storage_ptr__->options).sql_type_list.
                        super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                        super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
  local_b8 = (pointer)(__return_storage_ptr__->options).sql_type_list.
                      super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage;
  (__return_storage_ptr__->options).sql_type_list.
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_2f8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (__return_storage_ptr__->options).sql_type_list.
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_2f8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->options).sql_type_list.
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_2f8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_2f8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2f8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2f8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)local_c8);
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_M_move_assign((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    *)&(__return_storage_ptr__->options).sql_types_per_column,&local_98);
  (__return_storage_ptr__->options).columns_set = (bool)uVar5;
  (__return_storage_ptr__->options).dialect_options.state_machine_options.comment =
       SUB42(local_394,0);
  (__return_storage_ptr__->options).dialect_options.rows_until_header = local_370;
  ::std::__cxx11::string::operator=
            ((string *)&(__return_storage_ptr__->options).encoding,(string *)&local_168);
  (__return_storage_ptr__->options).dialect_options.state_machine_options.strict_mode = CVar11;
  uVar13 = (*deserializer->_vptr_Deserializer[4])(deserializer,0x8e,"multi_file_reader");
  if ((char)uVar13 == '\0') {
    uVar5 = false;
  }
  else {
    iVar12 = (*deserializer->_vptr_Deserializer[0xc])(deserializer);
    uVar5 = (undefined1)iVar12;
  }
  (__return_storage_ptr__->options).multi_file_reader = (bool)uVar5;
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar13 & 0xff));
  (*deserializer->_vptr_Deserializer[2])(deserializer,0x8f,"buffer_size_option");
  (*deserializer->_vptr_Deserializer[6])(deserializer);
  CVar18 = CSVOption<unsigned_long>::Deserialize(deserializer);
  (*deserializer->_vptr_Deserializer[7])(deserializer);
  (__return_storage_ptr__->options).buffer_size_option.set_by_user = CVar18.set_by_user;
  (__return_storage_ptr__->options).buffer_size_option.value = CVar18.value;
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_358.value._M_dataplus._M_p != &local_358.value.field_2) {
    operator_delete(local_358.value._M_dataplus._M_p);
  }
  if (local_168 != &local_158) {
    operator_delete(local_168);
  }
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&local_98);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_2f8);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_2d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248.value._M_dataplus._M_p != &local_248.value.field_2) {
    operator_delete(local_248.value._M_dataplus._M_p);
  }
  if (local_410.super_vector<bool,_std::allocator<bool>_>.super__Bvector_base<std::allocator<bool>_>
      ._M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0)
  {
    operator_delete(local_410.super_vector<bool,_std::allocator<bool>_>.
                    super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                    _M_start.super__Bit_iterator_base._M_p);
    local_410.super_vector<bool,_std::allocator<bool>_>.super__Bvector_base<std::allocator<bool>_>.
    _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_410.super_vector<bool,_std::allocator<bool>_>.super__Bvector_base<std::allocator<bool>_>.
    _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
    local_410.super_vector<bool,_std::allocator<bool>_>.super__Bvector_base<std::allocator<bool>_>.
    _M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_410.super_vector<bool,_std::allocator<bool>_>.super__Bvector_base<std::allocator<bool>_>.
    _M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
    local_410.super_vector<bool,_std::allocator<bool>_>.super__Bvector_base<std::allocator<bool>_>.
    _M_impl.super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
  }
  if (local_128 != local_118) {
    operator_delete(local_128);
  }
  ::std::
  _Rb_tree<duckdb::LogicalTypeId,_std::pair<const_duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>_>,_std::_Select1st<std::pair<const_duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>_>_>,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>_>_>_>
  ::~_Rb_tree(&local_60);
  if (local_390 != &local_380) {
    operator_delete(local_390);
  }
  if (local_3e8.super_vector<bool,_std::allocator<bool>_>.super__Bvector_base<std::allocator<bool>_>
      ._M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0)
  {
    operator_delete(local_3e8.super_vector<bool,_std::allocator<bool>_>.
                    super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                    _M_start.super__Bit_iterator_base._M_p);
    local_3e8.super_vector<bool,_std::allocator<bool>_>.super__Bvector_base<std::allocator<bool>_>.
    _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_3e8.super_vector<bool,_std::allocator<bool>_>.super__Bvector_base<std::allocator<bool>_>.
    _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
    local_3e8.super_vector<bool,_std::allocator<bool>_>.super__Bvector_base<std::allocator<bool>_>.
    _M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_3e8.super_vector<bool,_std::allocator<bool>_>.super__Bvector_base<std::allocator<bool>_>.
    _M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
    local_3e8.super_vector<bool,_std::allocator<bool>_>.super__Bvector_base<std::allocator<bool>_>.
    _M_impl.super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
  }
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_200.custom_options._M_h);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200.filename_column._M_dataplus._M_p != &local_200.filename_column.field_2) {
    operator_delete(local_200.filename_column._M_dataplus._M_p);
  }
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_200.hive_types_schema._M_h);
  if (local_108 != local_f8) {
    operator_delete(local_108);
  }
  if (local_e8 != local_d8) {
    operator_delete(local_e8);
  }
  if (local_3c0.super_vector<bool,_std::allocator<bool>_>.super__Bvector_base<std::allocator<bool>_>
      ._M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0)
  {
    operator_delete(local_3c0.super_vector<bool,_std::allocator<bool>_>.
                    super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                    _M_start.super__Bit_iterator_base._M_p);
    local_3c0.super_vector<bool,_std::allocator<bool>_>.super__Bvector_base<std::allocator<bool>_>.
    _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_3c0.super_vector<bool,_std::allocator<bool>_>.super__Bvector_base<std::allocator<bool>_>.
    _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
    local_3c0.super_vector<bool,_std::allocator<bool>_>.super__Bvector_base<std::allocator<bool>_>.
    _M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_3c0.super_vector<bool,_std::allocator<bool>_>.super__Bvector_base<std::allocator<bool>_>.
    _M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
    local_3c0.super_vector<bool,_std::allocator<bool>_>.super__Bvector_base<std::allocator<bool>_>.
    _M_impl.super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
  }
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_2b8);
  return __return_storage_ptr__;
}

Assistant:

SerializedCSVReaderOptions SerializedCSVReaderOptions::Deserialize(Deserializer &deserializer) {
	auto options_ignore_errors = deserializer.ReadPropertyWithExplicitDefault<bool>(100, "ignore_errors", false);
	auto options_buffer_sample_size = deserializer.ReadPropertyWithDefault<idx_t>(101, "buffer_sample_size");
	auto options_null_str = deserializer.ReadPropertyWithDefault<vector<string>>(102, "null_str");
	auto options_compression = deserializer.ReadProperty<FileCompressionType>(103, "compression");
	auto options_allow_quoted_nulls = deserializer.ReadPropertyWithDefault<bool>(104, "allow_quoted_nulls");
	auto options_maximum_line_size = deserializer.ReadProperty<CSVOption<idx_t>>(105, "maximum_line_size");
	auto options_normalize_names = deserializer.ReadPropertyWithDefault<bool>(106, "normalize_names");
	auto options_force_not_null = deserializer.ReadPropertyWithDefault<vector<bool>>(107, "force_not_null");
	auto options_all_varchar = deserializer.ReadPropertyWithDefault<bool>(108, "all_varchar");
	auto options_sample_size_chunks = deserializer.ReadPropertyWithDefault<idx_t>(109, "sample_size_chunks");
	auto options_auto_detect = deserializer.ReadPropertyWithDefault<bool>(110, "auto_detect");
	auto options_file_path = deserializer.ReadPropertyWithDefault<string>(111, "file_path");
	auto options_decimal_separator = deserializer.ReadPropertyWithDefault<string>(112, "decimal_separator");
	auto options_null_padding = deserializer.ReadPropertyWithDefault<bool>(113, "null_padding");
	deserializer.ReadDeletedProperty<idx_t>(114, "buffer_size");
	auto file_options = deserializer.ReadProperty<MultiFileOptions>(115, "file_options");
	auto options_force_quote = deserializer.ReadPropertyWithDefault<vector<bool>>(116, "force_quote");
	auto options_rejects_table_name = deserializer.ReadPropertyWithExplicitDefault<string>(117, "rejects_table_name", "reject_errors");
	auto options_rejects_limit = deserializer.ReadPropertyWithDefault<idx_t>(118, "rejects_limit");
	deserializer.ReadDeletedProperty<vector<string>>(119, "rejects_recovery_columns");
	deserializer.ReadDeletedProperty<vector<idx_t>>(120, "rejects_recovery_column_ids");
	auto options_dialect_options_state_machine_options_delimiter = deserializer.ReadProperty<CSVOption<char>>(121, "delimiter");
	auto options_dialect_options_state_machine_options_quote = deserializer.ReadProperty<CSVOption<char>>(122, "quote");
	auto options_dialect_options_state_machine_options_escape = deserializer.ReadProperty<CSVOption<char>>(123, "escape");
	auto options_dialect_options_header = deserializer.ReadProperty<CSVOption<bool>>(124, "header");
	auto options_dialect_options_num_cols = deserializer.ReadPropertyWithDefault<idx_t>(125, "num_cols");
	auto options_dialect_options_state_machine_options_new_line = deserializer.ReadProperty<CSVOption<NewLineIdentifier>>(126, "new_line");
	auto options_dialect_options_skip_rows = deserializer.ReadProperty<CSVOption<idx_t>>(127, "skip_rows");
	auto options_dialect_options_date_format = deserializer.ReadProperty<map<LogicalTypeId, CSVOption<StrpTimeFormat>>>(128, "date_format");
	auto options_sniffer_user_mismatch_error = deserializer.ReadPropertyWithDefault<string>(129, "sniffer_user_mismatch_error");
	auto options_parallel = deserializer.ReadPropertyWithDefault<bool>(130, "parallel");
	auto options_was_type_manually_set = deserializer.ReadPropertyWithDefault<vector<bool>>(131, "was_type_manually_set");
	auto options_rejects_scan_name = deserializer.ReadPropertyWithExplicitDefault<CSVOption<string>>(132, "rejects_scan_name", {"reject_scans"});
	auto options_name_list = deserializer.ReadPropertyWithDefault<vector<string>>(133, "name_list");
	auto options_sql_type_list = deserializer.ReadPropertyWithDefault<vector<LogicalType>>(134, "sql_type_list");
	auto options_sql_types_per_column = deserializer.ReadPropertyWithDefault<case_insensitive_map_t<idx_t>>(135, "sql_types_per_column");
	auto options_columns_set = deserializer.ReadPropertyWithExplicitDefault<bool>(136, "columns_set", false);
	auto options_dialect_options_state_machine_options_comment = deserializer.ReadPropertyWithExplicitDefault<CSVOption<char>>(137, "comment", CSVOption<char>('\0'));
	auto options_dialect_options_rows_until_header = deserializer.ReadPropertyWithDefault<idx_t>(138, "rows_until_header");
	auto options_encoding = deserializer.ReadPropertyWithDefault<string>(139, "encoding");
	auto options_dialect_options_state_machine_options_strict_mode = deserializer.ReadProperty<CSVOption<bool>>(140, "strict_mode");
	auto options_multi_byte_delimiter = deserializer.ReadProperty<CSVOption<string>>(141, "multi_byte_delimiter");
	SerializedCSVReaderOptions result(options_dialect_options_state_machine_options_delimiter, options_multi_byte_delimiter);
	result.options.ignore_errors = options_ignore_errors;
	result.options.buffer_sample_size = options_buffer_sample_size;
	result.options.null_str = std::move(options_null_str);
	result.options.compression = options_compression;
	result.options.allow_quoted_nulls = options_allow_quoted_nulls;
	result.options.maximum_line_size = options_maximum_line_size;
	result.options.normalize_names = options_normalize_names;
	result.options.force_not_null = std::move(options_force_not_null);
	result.options.all_varchar = options_all_varchar;
	result.options.sample_size_chunks = options_sample_size_chunks;
	result.options.auto_detect = options_auto_detect;
	result.options.file_path = std::move(options_file_path);
	result.options.decimal_separator = std::move(options_decimal_separator);
	result.options.null_padding = options_null_padding;
	result.file_options = file_options;
	result.options.force_quote = std::move(options_force_quote);
	result.options.rejects_table_name = std::move(options_rejects_table_name);
	result.options.rejects_limit = options_rejects_limit;
	result.options.dialect_options.state_machine_options.quote = options_dialect_options_state_machine_options_quote;
	result.options.dialect_options.state_machine_options.escape = options_dialect_options_state_machine_options_escape;
	result.options.dialect_options.header = options_dialect_options_header;
	result.options.dialect_options.num_cols = options_dialect_options_num_cols;
	result.options.dialect_options.state_machine_options.new_line = options_dialect_options_state_machine_options_new_line;
	result.options.dialect_options.skip_rows = options_dialect_options_skip_rows;
	result.options.dialect_options.date_format = options_dialect_options_date_format;
	result.options.sniffer_user_mismatch_error = std::move(options_sniffer_user_mismatch_error);
	result.options.parallel = options_parallel;
	result.options.was_type_manually_set = std::move(options_was_type_manually_set);
	result.options.rejects_scan_name = options_rejects_scan_name;
	result.options.name_list = std::move(options_name_list);
	result.options.sql_type_list = std::move(options_sql_type_list);
	result.options.sql_types_per_column = std::move(options_sql_types_per_column);
	result.options.columns_set = options_columns_set;
	result.options.dialect_options.state_machine_options.comment = options_dialect_options_state_machine_options_comment;
	result.options.dialect_options.rows_until_header = options_dialect_options_rows_until_header;
	result.options.encoding = std::move(options_encoding);
	result.options.dialect_options.state_machine_options.strict_mode = options_dialect_options_state_machine_options_strict_mode;
	deserializer.ReadPropertyWithDefault<bool>(142, "multi_file_reader", result.options.multi_file_reader);
	deserializer.ReadProperty<CSVOption<idx_t>>(143, "buffer_size_option", result.options.buffer_size_option);
	return result;
}